

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void getTextNode(TidyDocImpl *doc,Node *node)

{
  tmbchar tVar1;
  int iVar2;
  Bool BVar3;
  ulong uVar4;
  Node *node_00;
  
  BVar3 = prvTidynodeIsText(node);
  if (BVar3 != no) {
    uVar4 = (ulong)node->start;
    if (node->start < node->end) {
      do {
        iVar2 = (doc->access).counter;
        if (0x7e < (long)iVar2) {
          return;
        }
        tVar1 = doc->lexer->lexbuf[uVar4];
        (doc->access).counter = iVar2 + 1;
        (doc->access).textNode[iVar2] = tVar1;
        uVar4 = uVar4 + 1;
      } while (uVar4 < node->end);
    }
    for (node_00 = node->content; node_00 != (Node *)0x0; node_00 = node_00->next) {
      getTextNode(doc,node_00);
    }
  }
  return;
}

Assistant:

static void getTextNode( TidyDocImpl* doc, Node* node )
{
    tmbstr txtnod = doc->access.textNode;       
    
    /* 
       Continues to traverse through container element until it no
       longer contains any more contents 
    */

    /* If the tag of the node is NULL, then grab the text within the node */
    if ( TY_(nodeIsText)(node) )
    {
        uint i;

        /* Retrieves each character found within the text node */
        for (i = node->start; i < node->end; i++)
        {
            /* The text must not exceed buffer */
            if ( doc->access.counter >= TEXTBUF_SIZE-1 )
                return;

            txtnod[ doc->access.counter++ ] = doc->lexer->lexbuf[i];
        }

        /* Traverses through the contents within a container element */
        for ( node = node->content; node != NULL; node = node->next )
            getTextNode( doc, node );
    }   
}